

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O3

bool __thiscall
calc_server::calc_state_machine::apply_snapshot(calc_state_machine *this,snapshot *s)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->snapshots_lock_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  p_Var5 = (this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    uVar2 = s->last_log_idx_;
    p_Var1 = &(this->snapshots_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var5 + 1) >= uVar2) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(ulong *)(p_Var4 + 1) <= uVar2)) {
      p_Var5 = p_Var4[1]._M_parent;
      p_Var4 = p_Var4[1]._M_left;
      if (p_Var4 == (_Base_ptr)0x0) {
        LOCK();
        (this->cur_value_).super___atomic_base<long>._M_i = (__int_type_conflict2)p_Var5->_M_left;
        UNLOCK();
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
        }
        LOCK();
        (this->cur_value_).super___atomic_base<long>._M_i = (__int_type_conflict2)p_Var5->_M_left;
        UNLOCK();
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4);
      }
      bVar6 = true;
      goto LAB_00181971;
    }
  }
  bVar6 = false;
LAB_00181971:
  pthread_mutex_unlock((pthread_mutex_t *)&this->snapshots_lock_);
  return bVar6;
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.find(s.get_last_log_idx());
        if (entry == snapshots_.end()) return false;

        ptr<snapshot_ctx> ctx = entry->second;
        cur_value_ = ctx->value_;
        return true;
    }